

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

ssize_t __thiscall chatter::Packet::write(Packet *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  uint64_t local_28;
  uint64_t local_20;
  int64_t net;
  int64_t data_local;
  Packet *this_local;
  
  local_28 = CONCAT44(in_register_00000034,__fd);
  net = local_28;
  data_local = (int64_t)this;
  local_20 = platform::HostToNet64(&local_28);
  append_bytes(this,&local_20,8);
  return extraout_RAX;
}

Assistant:

void Packet::write(int64_t data)
{
    int64_t net = platform::HostToNet64(data);
    append_bytes(&net, sizeof(net));
}